

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_optimize.cc
# Opt level: O2

void __thiscall pass_inline_pass_Test::TestBody(pass_inline_pass_Test *this)

{
  bool bVar1;
  Generator *this_00;
  Generator *child;
  Port *var;
  Var *pVVar2;
  Expr *right;
  Var *right_00;
  mapped_type *pmVar3;
  char *message;
  char *in_R9;
  undefined1 local_238 [8];
  Context ctx;
  mapped_type src;
  shared_ptr<kratos::Attribute> attr;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_;
  key_type local_b0;
  undefined1 local_90 [8];
  VerilogModule vmod;
  
  kratos::Context::Context((Context *)local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"mod",(allocator<char> *)local_e0);
  this_00 = kratos::Context::generator((Context *)local_238,(string *)local_90);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"child",(allocator<char> *)local_e0);
  child = kratos::Context::generator((Context *)local_238,(string *)local_90);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"inst",(allocator<char> *)local_e0);
  kratos::Generator::add_child_generator(this_00,(string *)local_90,child);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"in1",(allocator<char> *)local_e0);
  attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       kratos::Generator::port(child,In,(string *)local_90,1);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"in2",(allocator<char> *)local_e0);
  var = kratos::Generator::port(child,In,(string *)local_90,1);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"v",(allocator<char> *)local_e0);
  pVVar2 = kratos::Generator::var(child,(string *)local_90,1);
  std::__cxx11::string::~string((string *)local_90);
  right = kratos::Var::operator&
                    ((Var *)attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi,&var->super_Var);
  kratos::Generator::wire(child,pVVar2,&right->super_Var);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"v1",(allocator<char> *)local_e0);
  pVVar2 = kratos::Generator::var(this_00,(string *)local_90,1);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"v2",(allocator<char> *)local_e0);
  right_00 = kratos::Generator::var(this_00,(string *)local_90,1);
  std::__cxx11::string::~string((string *)local_90);
  kratos::Generator::wire
            (this_00,(Var *)attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi,pVVar2);
  kratos::Generator::wire(this_00,&var->super_Var,right_00);
  kratos::fix_assignment_type(this_00);
  kratos::verify_generator_connectivity(this_00);
  kratos::verify_assignments(this_00);
  std::make_shared<kratos::Attribute>();
  std::__cxx11::string::assign((char *)(src.field_2._8_8_ + 0x28));
  std::vector<std::shared_ptr<kratos::Attribute>,std::allocator<std::shared_ptr<kratos::Attribute>>>
  ::emplace_back<std::shared_ptr<kratos::Attribute>const&>
            ((vector<std::shared_ptr<kratos::Attribute>,std::allocator<std::shared_ptr<kratos::Attribute>>>
              *)&(child->super_IRNode).attributes_,
             (shared_ptr<kratos::Attribute> *)((long)&src.field_2 + 8));
  kratos::inline_instance(this_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"inst",
             (allocator<char> *)&ctx.tracked_generators_._M_h._M_single_bucket);
  bVar1 = kratos::Generator::has_child_generator(this_00,(string *)local_90);
  local_e0[0] = (allocator<char>)!bVar1;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  std::__cxx11::string::~string((string *)local_90);
  if (local_e0[0] == (allocator<char>)0x0) {
    testing::Message::Message((Message *)&ctx.tracked_generators_._M_h._M_single_bucket);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_90,(internal *)local_e0,
               (AssertionResult *)"mod.has_child_generator(\"inst\")","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x1e3,(char *)local_90);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_b0,(Message *)&ctx.tracked_generators_._M_h._M_single_bucket);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    std::__cxx11::string::~string((string *)local_90);
    if (ctx.tracked_generators_._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (*(code *)(ctx.tracked_generators_._M_h._M_single_bucket)->_M_nxt[1]._M_nxt)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  kratos::VerilogModule::VerilogModule((VerilogModule *)local_90,this_00);
  kratos::VerilogModule::verilog_src_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_e0,(VerilogModule *)local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"mod",(allocator<char> *)&vmod.manager_.collect_perf_);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_e0,&local_b0);
  std::__cxx11::string::string
            ((string *)&ctx.tracked_generators_._M_h._M_single_bucket,(string *)pmVar3);
  std::__cxx11::string::~string((string *)&local_b0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_e0);
  local_b0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::find
                          ((char *)&ctx.tracked_generators_._M_h._M_single_bucket,0x21f9ee);
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)local_e0,"src.find(\"assign v = v1 & v2;\")","std::string::npos",
             (unsigned_long *)&local_b0,&std::__cxx11::string::npos);
  if (local_e0[0] == (allocator<char>)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (gtest_ar_._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar_._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&vmod.manager_.collect_perf_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x1e7,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&vmod.manager_.collect_perf_,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&vmod.manager_.collect_perf_);
    if ((long *)local_b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_b0._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  std::__cxx11::string::~string((string *)&ctx.tracked_generators_._M_h._M_single_bucket);
  kratos::PassManager::~PassManager((PassManager *)&vmod);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&attr);
  kratos::Context::~Context((Context *)local_238);
  return;
}

Assistant:

TEST(pass, inline_pass) {
    Context ctx;
    auto &mod = ctx.generator("mod");
    auto &child = ctx.generator("child");
    mod.add_child_generator("inst", child);
    auto &in1 = child.port(PortDirection::In, "in1", 1);
    auto &in2 = child.port(PortDirection::In, "in2", 1);
    auto &v = child.var("v", 1);
    child.wire(v, in1 & in2);
    auto &v1 = mod.var("v1", 1);
    auto &v2 = mod.var("v2", 1);
    mod.wire(in1, v1);
    mod.wire(in2, v2);

    fix_assignment_type(&mod);
    verify_generator_connectivity(&mod);
    verify_assignments(&mod);

    auto attr = std::make_shared<Attribute>();
    attr->value_str = "inline";
    child.add_attribute(attr);

    inline_instance(&mod);

    EXPECT_FALSE(mod.has_child_generator("inst"));

    VerilogModule vmod(&mod);
    auto src = vmod.verilog_src()["mod"];
    EXPECT_NE(src.find("assign v = v1 & v2;"), std::string::npos);
}